

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaSAXHandleStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  xmlChar *value_00;
  xmlChar *value;
  int l;
  int k;
  int valueLen;
  int newSize;
  size_t elemSize;
  xmlChar **tmp;
  int j;
  int i;
  xmlSchemaNodeInfoPtr ielem;
  int ret;
  xmlSchemaValidCtxtPtr vctxt;
  xmlChar **namespaces_local;
  int nb_namespaces_local;
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  *(int *)((long)ctx + 0xac) = *(int *)((long)ctx + 0xac) + 1;
  if ((*(int *)((long)ctx + 0x130) == -1) ||
     (*(int *)((long)ctx + 0xac) < *(int *)((long)ctx + 0x130))) {
    iVar2 = xmlSchemaValidatorPushElem((xmlSchemaValidCtxtPtr)ctx);
    if (iVar2 == -1) {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",
                 "calling xmlSchemaValidatorPushElem()");
    }
    else {
      lVar1 = *(long *)((long)ctx + 0xc0);
      iVar2 = xmlSAX2GetLineNumber(*(void **)((long)ctx + 0x50));
      *(int *)(lVar1 + 0x10) = iVar2;
      *(xmlChar **)(lVar1 + 0x18) = localname;
      *(xmlChar **)(lVar1 + 0x20) = URI;
      *(uint *)(lVar1 + 0x40) = *(uint *)(lVar1 + 0x40) | 0x20;
      if (nb_namespaces != 0) {
        tmp._0_4_ = 0;
        for (tmp._4_4_ = 0; tmp._4_4_ < nb_namespaces; tmp._4_4_ = tmp._4_4_ + 1) {
          if (*(int *)(lVar1 + 0x84) <= *(int *)(lVar1 + 0x80)) {
            iVar2 = xmlGrowCapacity(*(int *)(lVar1 + 0x84),0x10,5,1000000000);
            if (iVar2 < 0) {
              xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx);
              goto LAB_001d615d;
            }
            pvVar3 = (*xmlRealloc)(*(void **)(lVar1 + 0x78),(long)iVar2 * 0x10);
            if (pvVar3 == (void *)0x0) {
              xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx);
              goto LAB_001d615d;
            }
            *(void **)(lVar1 + 0x78) = pvVar3;
            *(int *)(lVar1 + 0x84) = iVar2;
          }
          *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(*(int *)(lVar1 + 0x80) << 1) * 8) =
               namespaces[(int)tmp];
          if (*namespaces[(int)tmp + 1] == '\0') {
            *(undefined8 *)(*(long *)(lVar1 + 0x78) + (long)(*(int *)(lVar1 + 0x80) * 2 + 1) * 8) =
                 0;
          }
          else {
            *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(*(int *)(lVar1 + 0x80) * 2 + 1) * 8) =
                 namespaces[(int)tmp + 1];
          }
          *(int *)(lVar1 + 0x80) = *(int *)(lVar1 + 0x80) + 1;
          tmp._0_4_ = (int)tmp + 2;
        }
      }
      if (nb_attributes != 0) {
        tmp._0_4_ = 0;
        for (tmp._4_4_ = 0; tmp._4_4_ < nb_attributes; tmp._4_4_ = tmp._4_4_ + 1) {
          iVar2 = (int)attributes[(int)tmp + 4] - (int)attributes[(int)tmp + 3];
          value_00 = (xmlChar *)(*xmlMalloc)((long)(iVar2 + 1));
          if (value_00 == (xmlChar *)0x0) {
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx);
            goto LAB_001d615d;
          }
          value._4_4_ = 0;
          value._0_4_ = 0;
          while (value._4_4_ < iVar2) {
            if ((((value._4_4_ < iVar2 + -4) && (attributes[(int)tmp + 3][value._4_4_] == '&')) &&
                (attributes[(int)tmp + 3][value._4_4_ + 1] == '#')) &&
               (((attributes[(int)tmp + 3][value._4_4_ + 2] == '3' &&
                 (attributes[(int)tmp + 3][value._4_4_ + 3] == '8')) &&
                (attributes[(int)tmp + 3][value._4_4_ + 4] == ';')))) {
              value_00[(int)value] = '&';
              value._4_4_ = value._4_4_ + 5;
            }
            else {
              value_00[(int)value] = attributes[(int)tmp + 3][value._4_4_];
              value._4_4_ = value._4_4_ + 1;
            }
            value._0_4_ = (int)value + 1;
          }
          value_00[(int)value] = '\0';
          iVar2 = xmlSchemaValidatorPushAttribute
                            ((xmlSchemaValidCtxtPtr)ctx,(xmlNodePtr)0x0,*(int *)(lVar1 + 0x10),
                             attributes[(int)tmp],attributes[(int)tmp + 2],0,value_00,1);
          if (iVar2 == -1) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",
                       "calling xmlSchemaValidatorPushAttribute()");
            goto LAB_001d615d;
          }
          tmp._0_4_ = (int)tmp + 5;
        }
      }
      iVar2 = xmlSchemaValidateElem((xmlSchemaValidCtxtPtr)ctx);
      if (iVar2 == 0) {
        return;
      }
      if (iVar2 != -1) {
        return;
      }
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",
                 "calling xmlSchemaValidateElem()");
    }
LAB_001d615d:
    *(undefined4 *)((long)ctx + 0x68) = 0xffffffff;
    xmlStopParser(*(xmlParserCtxtPtr *)((long)ctx + 0x50));
  }
  return;
}

Assistant:

static void
xmlSchemaSAXHandleStartElementNs(void *ctx,
				 const xmlChar * localname,
				 const xmlChar * prefix ATTRIBUTE_UNUSED,
				 const xmlChar * URI,
				 int nb_namespaces,
				 const xmlChar ** namespaces,
				 int nb_attributes,
				 int nb_defaulted ATTRIBUTE_UNUSED,
				 const xmlChar ** attributes)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;
    int ret;
    xmlSchemaNodeInfoPtr ielem;
    int i, j;

    /*
    * SAX VAL TODO: What to do with nb_defaulted?
    */
    /*
    * Skip elements if inside a "skip" wildcard or invalid.
    */
    vctxt->depth++;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    /*
    * Push the element.
    */
    if (xmlSchemaValidatorPushElem(vctxt) == -1) {
	VERROR_INT("xmlSchemaSAXHandleStartElementNs",
	    "calling xmlSchemaValidatorPushElem()");
	goto internal_error;
    }
    ielem = vctxt->inode;
    /*
    * TODO: Is this OK?
    */
    ielem->nodeLine = xmlSAX2GetLineNumber(vctxt->parserCtxt);
    ielem->localName = localname;
    ielem->nsName = URI;
    ielem->flags |= XML_SCHEMA_ELEM_INFO_EMPTY;
    /*
    * Register namespaces on the elem info.
    */
    if (nb_namespaces != 0) {
	/*
	* Although the parser builds its own namespace list,
	* we have no access to it, so we'll use an own one.
	*/
        for (i = 0, j = 0; i < nb_namespaces; i++, j += 2) {
	    /*
	    * Store prefix and namespace name.
	    */
            if (ielem->sizeNsBindings <= ielem->nbNsBindings) {
                const xmlChar **tmp;
                size_t elemSize = 2 * sizeof(tmp[0]);
                int newSize;

                newSize = xmlGrowCapacity(ielem->sizeNsBindings, elemSize,
                                          5, XML_MAX_ITEMS);
                if (newSize < 0) {
                    xmlSchemaVErrMemory(vctxt);
                    goto internal_error;
                }
                tmp = xmlRealloc(ielem->nsBindings, newSize * elemSize);
                if (tmp == NULL) {
                    xmlSchemaVErrMemory(vctxt);
                    goto internal_error;
                }

                ielem->nsBindings = tmp;
                ielem->sizeNsBindings = newSize;
	    }

	    ielem->nsBindings[ielem->nbNsBindings * 2] = namespaces[j];
	    if (namespaces[j+1][0] == 0) {
		/*
		* Handle xmlns="".
		*/
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] = NULL;
	    } else
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] =
		    namespaces[j+1];
	    ielem->nbNsBindings++;
	}
    }
    /*
    * Register attributes.
    * SAX VAL TODO: We are not adding namespace declaration
    * attributes yet.
    */
    if (nb_attributes != 0) {
	int valueLen, k, l;
	xmlChar *value;

        for (j = 0, i = 0; i < nb_attributes; i++, j += 5) {
	    /*
	    * Duplicate the value, changing any &#38; to a literal ampersand.
	    *
	    * libxml2 differs from normal SAX here in that it escapes all ampersands
	    * as &#38; instead of delivering the raw converted string. Changing the
	    * behavior at this point would break applications that use this API, so
	    * we are forced to work around it.
	    */
	    valueLen = attributes[j+4] - attributes[j+3];
	    value = xmlMalloc(valueLen + 1);
	    if (value == NULL) {
		xmlSchemaVErrMemory(vctxt);
		goto internal_error;
	    }
	    for (k = 0, l = 0; k < valueLen; l++) {
		if (k < valueLen - 4 &&
		    attributes[j+3][k+0] == '&' &&
		    attributes[j+3][k+1] == '#' &&
		    attributes[j+3][k+2] == '3' &&
		    attributes[j+3][k+3] == '8' &&
		    attributes[j+3][k+4] == ';') {
		    value[l] = '&';
		    k += 5;
		} else {
		    value[l] = attributes[j+3][k];
		    k++;
		}
	    }
	    value[l] = '\0';
	    /*
	    * TODO: Set the node line.
	    */
	    ret = xmlSchemaValidatorPushAttribute(vctxt,
		NULL, ielem->nodeLine, attributes[j], attributes[j+2], 0,
		value, 1);
	    if (ret == -1) {
		VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		    "calling xmlSchemaValidatorPushAttribute()");
		goto internal_error;
	    }
	}
    }
    /*
    * Validate the element.
    */
    ret = xmlSchemaValidateElem(vctxt);
    if (ret != 0) {
	if (ret == -1) {
	    VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		"calling xmlSchemaValidateElem()");
	    goto internal_error;
	}
	goto exit;
    }

exit:
    return;
internal_error:
    vctxt->err = -1;
    xmlStopParser(vctxt->parserCtxt);
}